

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_type_spec(t_php_generator *this,ostream *out,t_type *t)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  t_program *p;
  undefined4 extraout_var;
  t_type *ptVar4;
  undefined8 *puVar5;
  string local_e8;
  t_type *local_c8;
  t_type *etype;
  string local_a0;
  t_type *local_80;
  t_type *vtype;
  t_type *ktype;
  string local_40;
  t_map *local_20;
  t_type *t_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  local_20 = (t_map *)t;
  t_local = (t_type *)out;
  out_local = (ostream *)this;
  local_20 = (t_map *)t_generator::get_true_type(t);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
  poVar3 = std::operator<<(poVar3,"\'type\' => ");
  type_to_enum_abi_cxx11_(&local_40,this,(t_type *)local_20);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,",");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
    if ((((uVar1 & 1) == 0) &&
        (uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
        (uVar1 & 1) == 0)) &&
       (uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])(),
       (uVar1 & 1) == 0)) {
      uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
        if (((uVar1 & 1) == 0) &&
           (uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])(),
           (uVar1 & 1) == 0)) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "compiler error: no type for php struct spec field";
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
        uVar1 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
        if ((uVar1 & 1) == 0) {
          ptVar4 = t_set::get_elem_type((t_set *)local_20);
          local_c8 = t_generator::get_true_type(ptVar4);
        }
        else {
          ptVar4 = t_list::get_elem_type((t_list *)local_20);
          local_c8 = t_generator::get_true_type(ptVar4);
        }
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'etype\' => ");
        type_to_enum_abi_cxx11_(&local_e8,this,local_c8);
        poVar3 = std::operator<<(poVar3,(string *)&local_e8);
        poVar3 = std::operator<<(poVar3,",");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e8);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'elem\' => array(");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        generate_php_type_spec(this,(ostream *)t_local,local_c8);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"),");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
      }
      else {
        ptVar4 = t_map::get_key_type(local_20);
        vtype = t_generator::get_true_type(ptVar4);
        ptVar4 = t_map::get_val_type(local_20);
        local_80 = t_generator::get_true_type(ptVar4);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'ktype\' => ");
        type_to_enum_abi_cxx11_(&local_a0,this,vtype);
        poVar3 = std::operator<<(poVar3,(string *)&local_a0);
        poVar3 = std::operator<<(poVar3,",");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_a0);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'vtype\' => ");
        type_to_enum_abi_cxx11_((string *)&etype,this,local_80);
        poVar3 = std::operator<<(poVar3,(string *)&etype);
        poVar3 = std::operator<<(poVar3,",");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&etype);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'key\' => array(");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        generate_php_type_spec(this,(ostream *)t_local,vtype);
        t_generator::indent_down((t_generator *)this);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"),");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"\'val\' => array(");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        generate_php_type_spec(this,(ostream *)t_local,local_80);
        poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
        poVar3 = std::operator<<(poVar3,"),");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)t_local);
      poVar3 = std::operator<<(poVar3,"\'class\' => \'");
      p = t_type::get_program((t_type *)local_20);
      php_namespace_abi_cxx11_((string *)&ktype,this,p);
      poVar3 = std::operator<<(poVar3,(string *)&ktype);
      iVar2 = (*(local_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
      poVar3 = std::operator<<(poVar3,"\',");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&ktype);
    }
  }
  return;
}

Assistant:

void t_php_generator::generate_php_type_spec(ostream& out, t_type* t) {
  t = get_true_type(t);
  indent(out) << "'type' => " << type_to_enum(t) << "," << endl;

  if (t->is_base_type()) {
    // Noop, type is all we need
  } else if (t->is_struct() || t->is_xception() || t->is_enum()) {
    indent(out) << "'class' => '" << php_namespace(t->get_program()) << t->get_name() << "',"
                << endl;
  } else if (t->is_map()) {
    t_type* ktype = get_true_type(((t_map*)t)->get_key_type());
    t_type* vtype = get_true_type(((t_map*)t)->get_val_type());
    indent(out) << "'ktype' => " << type_to_enum(ktype) << "," << endl;
    indent(out) << "'vtype' => " << type_to_enum(vtype) << "," << endl;
    indent(out) << "'key' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, ktype);
    indent_down();
    indent(out) << ")," << endl;
    indent(out) << "'val' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, vtype);
    indent(out) << ")," << endl;
    indent_down();
  } else if (t->is_list() || t->is_set()) {
    t_type* etype;
    if (t->is_list()) {
      etype = get_true_type(((t_list*)t)->get_elem_type());
    } else {
      etype = get_true_type(((t_set*)t)->get_elem_type());
    }
    indent(out) << "'etype' => " << type_to_enum(etype) << "," << endl;
    indent(out) << "'elem' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, etype);
    indent(out) << ")," << endl;
    indent_down();
  } else {
    throw "compiler error: no type for php struct spec field";
  }
}